

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::loadNode(CoronaLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  FileName *in_RDX;
  Node *in_RDI;
  Ref<embree::XML> *in_stack_00000078;
  CoronaLoader *in_stack_00000080;
  char *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Ref<embree::XML> *in_stack_ffffffffffffff08;
  CoronaLoader *in_stack_ffffffffffffff10;
  string local_e8 [16];
  ParseLocation *in_stack_ffffffffffffff28;
  FileName *fileName;
  CoronaLoader *in_stack_ffffffffffffffc0;
  
  fileName = in_RDX;
  bVar1 = std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  if (bVar1) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (bVar1) {
      load<embree::FileName>(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      loadMaterialLibrary(in_stack_ffffffffffffffc0,fileName);
      embree::FileName::~FileName((FileName *)0x40ec47);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      if (bVar1) {
        (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
        if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
        }
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        if (bVar1) {
          (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          if (bVar1) {
            loadGroupNode(in_stack_00000080,in_stack_00000078);
          }
          else {
            bVar1 = std::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
            if (!bVar1) {
              __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x10);
              __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       &in_RDX->filename;
              ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff28);
              std::operator+(__lhs,(char *)__rhs);
              std::operator+(__lhs,__rhs);
              std::runtime_error::runtime_error((runtime_error *)__rhs,local_e8);
              __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
            if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
              (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
            }
          }
        }
      }
    }
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::loadNode(const Ref<XML>& xml)
  {
    if      (xml->name == "conffile"     ) return nullptr;
    else if (xml->name == "mtllib"       ) return loadMaterialLibrary(load<FileName>(xml));
    else if (xml->name == "camera"       ) return nullptr;
    else if (xml->name == "environment"  ) return nullptr;
    else if (xml->name == "geometryGroup") return loadGroupNode(xml);
    else if (xml->name == "renderElement") return nullptr;
    else THROW_RUNTIME_ERROR(xml->loc.str()+": unknown tag: "+xml->name);
    return nullptr;
  }